

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformations.c
# Opt level: O1

void al_use_projection_transform(ALLEGRO_TRANSFORM *trans)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint uVar8;
  ALLEGRO_BITMAP *bitmap;
  ALLEGRO_DISPLAY *pAVar9;
  
  bitmap = al_get_target_bitmap();
  if (bitmap != (ALLEGRO_BITMAP *)0x0) {
    uVar8 = al_get_bitmap_flags(bitmap);
    if ((uVar8 & 1) == 0) {
      if (&bitmap->transform != trans) {
        uVar1 = *(undefined8 *)trans->m[0];
        uVar2 = *(undefined8 *)(trans->m[0] + 2);
        uVar3 = *(undefined8 *)trans->m[1];
        uVar4 = *(undefined8 *)(trans->m[1] + 2);
        uVar5 = *(undefined8 *)trans->m[2];
        uVar6 = *(undefined8 *)(trans->m[2] + 2);
        uVar7 = *(undefined8 *)(trans->m[3] + 2);
        *(undefined8 *)(bitmap->proj_transform).m[3] = *(undefined8 *)trans->m[3];
        *(undefined8 *)((bitmap->proj_transform).m[3] + 2) = uVar7;
        *(undefined8 *)(bitmap->proj_transform).m[2] = uVar5;
        *(undefined8 *)((bitmap->proj_transform).m[2] + 2) = uVar6;
        *(undefined8 *)(bitmap->proj_transform).m[1] = uVar3;
        *(undefined8 *)((bitmap->proj_transform).m[1] + 2) = uVar4;
        *(undefined8 *)(bitmap->proj_transform).m[0] = uVar1;
        *(undefined8 *)((bitmap->proj_transform).m[0] + 2) = uVar2;
      }
      pAVar9 = _al_get_bitmap_display(bitmap);
      if (pAVar9 != (ALLEGRO_DISPLAY *)0x0) {
        (*pAVar9->vt->update_transformation)(pAVar9,bitmap);
        return;
      }
    }
  }
  return;
}

Assistant:

void al_use_projection_transform(const ALLEGRO_TRANSFORM *trans)
{
   ALLEGRO_BITMAP *target = al_get_target_bitmap();
   ALLEGRO_DISPLAY *display;

   if (!target)
      return;

   /* Memory bitmaps don't support custom projection transforms */
   if (al_get_bitmap_flags(target) & ALLEGRO_MEMORY_BITMAP)
      return;

   /* Changes to a back buffer should affect the front buffer, and vice versa.
    * Currently we rely on the fact that in the OpenGL drivers the back buffer
    * and front buffer bitmaps are exactly the same, and the DirectX driver
    * doesn't support front buffer bitmaps.
    */

   if (trans != &target->transform) {
      al_copy_transform(&target->proj_transform, trans);
   }

   display = _al_get_bitmap_display(target);
   if (display) {
      display->vt->update_transformation(display, target);
   }
}